

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

pair<bool,_std::pair<imrt::Station_*,_int>_> * __thiscall
imrt::ApertureILS::getLSBeamlet
          (pair<bool,_std::pair<imrt::Station_*,_int>_> *__return_storage_ptr__,ApertureILS *this,
          Plan *P)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  byte bVar4;
  size_t sVar5;
  Station *this_00;
  iterator it;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  
  Plan::best_beamlets(&sb,P,(this->super_ILS).bsize,(this->super_ILS).vsize,0);
  if (sb._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    __return_storage_ptr__->first = false;
    (__return_storage_ptr__->second).second = -1;
  }
  else {
    it._M_node = sb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar2 = rand();
    std::
    advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,int>
              (&it,(int)((ulong)(long)iVar2 % sb._M_t._M_impl.super__Rb_tree_header._M_node_count));
    this_00 = (Station *)it._M_node[1]._M_left;
    iVar2 = *(int *)&it._M_node[1]._M_right;
    bVar4 = *(byte *)&it._M_node[1]._M_parent;
    bVar1 = Station::isActiveBeamlet(this_00,iVar2);
    if (bVar1) {
      sVar5 = 1;
      while (bVar1 = isBeamletModifiable(this,iVar2,this_00,(bool)(~bVar4 & 1)), !bVar1) {
        if (sVar5 == sb._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          bVar4 = false;
          iVar2 = -1;
          break;
        }
        std::
        __advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,long>
                  (&it,1);
        if ((_Rb_tree_header *)it._M_node == &sb._M_t._M_impl.super__Rb_tree_header) {
          it._M_node = sb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        this_00 = (Station *)it._M_node[1]._M_left;
        iVar2 = *(int *)&it._M_node[1]._M_right;
        bVar4 = *(byte *)&it._M_node[1]._M_parent;
        sVar5 = sVar5 + 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"ERROR!: Beamlet ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
      poVar3 = std::operator<<(poVar3," not active in station");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this_00->angle);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = -1;
      bVar4 = false;
    }
    __return_storage_ptr__->first = (bool)bVar4;
    (__return_storage_ptr__->second).first = this_00;
    (__return_storage_ptr__->second).second = iVar2;
  }
  std::
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::~_Rb_tree(&sb._M_t);
  return __return_storage_ptr__;
}

Assistant:

pair <bool, pair<Station*, int> > ApertureILS::getLSBeamlet(Plan& P){
  auto sb = P.best_beamlets(bsize, vsize);
  Station* s;
  if (sb.size() < 1) return(make_pair(false, make_pair(s,-1))); 

  auto it = sb.begin();
  int addit = rand()%sb.size();
  std::advance(it,addit);

  s = it->second.first; 
  int beamlet = it->second.second;
  bool sign = it->first.second; 
  
  if (!s->isActiveBeamlet(beamlet)){ 
    cout<< "ERROR!: Beamlet "<< beamlet << " not active in station" << s->getAngle()  << endl;
    return(make_pair(false, make_pair(s,-1)));
  }

  int i=0;
  while (!isBeamletModifiable(beamlet, s, !sign)) {
    // If no beamlet was found return -1
    i++;
    if (i==sb.size()) {
      return(make_pair(false, make_pair(s,-1)));
    }
    std::advance(it,1);
    if (it==sb.end()) it = sb.begin();

    s = it->second.first; 
    beamlet = it->second.second;
    sign = it->first.second; 
  }
  return(make_pair(sign, make_pair(s,beamlet)));
}